

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O0

wchar_t assertion_text_file_contents(char *filename,wchar_t line,char *buff,char *fn)

{
  int iVar1;
  int iVar2;
  FILE *__stream;
  size_t sVar3;
  FILE *p;
  bool bVar4;
  wchar_t s;
  wchar_t n;
  FILE *f;
  char *ftxt;
  char *btxt;
  char *contents;
  char *fn_local;
  char *buff_local;
  wchar_t line_local;
  char *filename_local;
  
  assertion_count(filename,line);
  __stream = fopen(fn,"r");
  if (__stream == (FILE *)0x0) {
    failure_start(filename,line,"File doesn\'t exist: %s",fn);
    failure_finish((void *)0x0);
    filename_local._4_4_ = L'\0';
  }
  else {
    sVar3 = strlen(buff);
    iVar1 = (int)sVar3;
    p = (FILE *)malloc((long)(iVar1 * 2 + 0x80));
    sVar3 = fread(p,1,(long)(iVar1 * 2 + 0x7f),__stream);
    iVar2 = (int)sVar3;
    if (-1 < iVar2) {
      *(char *)((long)&p->_flags + (long)iVar2) = '\0';
    }
    fclose(__stream);
    f = p;
    ftxt = buff;
    while( true ) {
      bVar4 = false;
      if (*ftxt != '\0') {
        bVar4 = (char)f->_flags != '\0';
      }
      if (!bVar4) break;
      if (*ftxt == (char)f->_flags) {
        ftxt = ftxt + 1;
        f = (FILE *)((long)&f->_flags + 1);
      }
      else {
        if (((*ftxt != '\n') || ((char)f->_flags != '\r')) ||
           (*(char *)((long)&f->_flags + 1) != '\n')) break;
        ftxt = ftxt + 1;
        f = (FILE *)((long)&f->_flags + 2);
      }
    }
    if ((*ftxt == '\0') && ((char)f->_flags == '\0')) {
      free(p);
      filename_local._4_4_ = L'\x01';
    }
    else {
      failure_start(filename,line,"Contents don\'t match");
      logprintf("  file=\"%s\"\n",fn);
      if (iVar2 < 1) {
        logprintf("  File empty, contents should be:\n");
        hexdump(buff,(char *)0x0,(long)iVar1,0);
      }
      else {
        hexdump((char *)p,buff,(long)iVar2,0);
        logprintf("  expected\n");
        hexdump(buff,(char *)p,(long)iVar1,0);
      }
      failure_finish((void *)0x0);
      free(p);
      filename_local._4_4_ = L'\0';
    }
  }
  return filename_local._4_4_;
}

Assistant:

int
assertion_text_file_contents(const char *filename, int line, const char *buff, const char *fn)
{
	char *contents;
	const char *btxt, *ftxt;
	FILE *f;
	int n, s;

	assertion_count(filename, line);
	f = fopen(fn, "r");
	if (f == NULL) {
		failure_start(filename, line,
		    "File doesn't exist: %s", fn);
		failure_finish(NULL);
		return (0);
	}
	s = (int)strlen(buff);
	contents = malloc(s * 2 + 128);
	n = (int)fread(contents, 1, s * 2 + 128 - 1, f);
	if (n >= 0)
		contents[n] = '\0';
	fclose(f);
	/* Compare texts. */
	btxt = buff;
	ftxt = (const char *)contents;
	while (*btxt != '\0' && *ftxt != '\0') {
		if (*btxt == *ftxt) {
			++btxt;
			++ftxt;
			continue;
		}
		if (btxt[0] == '\n' && ftxt[0] == '\r' && ftxt[1] == '\n') {
			/* Pass over different new line characters. */
			++btxt;
			ftxt += 2;
			continue;
		}
		break;
	}
	if (*btxt == '\0' && *ftxt == '\0') {
		free(contents);
		return (1);
	}
	failure_start(filename, line, "Contents don't match");
	logprintf("  file=\"%s\"\n", fn);
	if (n > 0) {
		hexdump(contents, buff, n, 0);
		logprintf("  expected\n");
		hexdump(buff, contents, s, 0);
	} else {
		logprintf("  File empty, contents should be:\n");
		hexdump(buff, NULL, s, 0);
	}
	failure_finish(NULL);
	free(contents);
	return (0);
}